

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

bool __thiscall
HullLibrary::ComputeHull
          (HullLibrary *this,uint vcount,cbtVector3 *vertices,PHullResult *result,uint vlimit)

{
  int iVar1;
  int tris_count;
  uint local_1c;
  
  iVar1 = calchull(this,vertices,vcount,&result->m_Indices,(int *)&local_1c,vlimit);
  if (iVar1 != 0) {
    result->mIndexCount = local_1c * 3;
    result->mFaceCount = local_1c;
    result->mVertices = vertices;
    result->mVcount = vcount;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool HullLibrary::ComputeHull(unsigned int vcount, const cbtVector3 *vertices, PHullResult &result, unsigned int vlimit)
{
	int tris_count;
	int ret = calchull((cbtVector3 *)vertices, (int)vcount, result.m_Indices, tris_count, static_cast<int>(vlimit));
	if (!ret) return false;
	result.mIndexCount = (unsigned int)(tris_count * 3);
	result.mFaceCount = (unsigned int)tris_count;
	result.mVertices = (cbtVector3 *)vertices;
	result.mVcount = (unsigned int)vcount;
	return true;
}